

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnGameOver
          (RenX_LoggingPlugin *this,Server *server,WinType winType,TeamType *team,int gScore,
          int nScore)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  TeamType TVar8;
  __sv_type _Var9;
  undefined1 auVar10 [16];
  code *local_688;
  code *local_5f8;
  code *local_568;
  size_t local_4d0;
  char *local_4c8;
  size_t local_4b0;
  char *local_4a8;
  size_t local_490;
  char *local_488;
  size_t local_470;
  char *local_468;
  size_t local_450;
  char *local_448;
  string local_440;
  __sv_type local_420;
  __sv_type local_410;
  string local_400;
  __sv_type local_3e0;
  __sv_type local_3d0;
  undefined1 local_3c0 [16];
  __sv_type local_3b0;
  undefined1 local_3a0 [16];
  __sv_type local_390;
  undefined1 local_380 [16];
  __sv_type local_370;
  __sv_type local_360;
  undefined1 local_350 [16];
  __sv_type local_340;
  undefined1 local_330 [16];
  __sv_type local_320;
  undefined1 local_310 [16];
  __sv_type local_300;
  undefined1 local_2f0 [16];
  __sv_type local_2e0;
  string local_2d0;
  __sv_type local_2b0;
  __sv_type local_2a0;
  string local_290;
  __sv_type local_270;
  __sv_type local_260;
  undefined1 local_250 [16];
  __sv_type local_240;
  undefined1 local_230 [16];
  __sv_type local_220;
  undefined1 local_210 [16];
  __sv_type local_200;
  __sv_type local_1f0;
  undefined1 local_1e0 [16];
  __sv_type local_1d0;
  undefined1 local_1c0 [16];
  __sv_type local_1b0;
  undefined1 local_1a0 [16];
  __sv_type local_190;
  undefined1 local_180 [16];
  __sv_type local_170;
  string local_160;
  __sv_type local_140;
  __sv_type local_130;
  string local_120;
  __sv_type local_100;
  __sv_type local_f0;
  undefined1 local_e0 [16];
  __sv_type local_d0;
  undefined1 local_c0 [16];
  __sv_type local_b0;
  undefined1 local_a0 [16];
  __sv_type local_90;
  undefined1 local_70 [8];
  string msg;
  logFuncType func;
  uint local_3c;
  uint local_38;
  int loseScore;
  int winScore;
  TeamType loserTeam;
  int nScore_local;
  int gScore_local;
  TeamType *team_local;
  WinType winType_local;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  
  TVar8 = RenX::getEnemy(*team);
  if ((*team == GDI) || (local_3c = gScore, local_38 = nScore, *team != Nod)) {
    local_3c = nScore;
    local_38 = gScore;
  }
  if ((*(ulong *)&this->field_0xa0 >> 0x36 & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_70);
  if (winType == Tie) {
    if (*team == None) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &this->gameOverTieNoWinFmt);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &this->gameOverTieFmt);
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               &this->gameOverFmt);
  }
  bVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  auVar6._8_8_ = local_a0._8_8_;
  auVar6._0_8_ = local_a0._0_8_;
  auVar5._8_8_ = local_c0._8_8_;
  auVar5._0_8_ = local_c0._0_8_;
  auVar4._8_8_ = local_e0._8_8_;
  auVar4._0_8_ = local_e0._0_8_;
  auVar3._8_8_ = local_180._8_8_;
  auVar3._0_8_ = local_180._0_8_;
  auVar2._8_8_ = local_1a0._8_8_;
  auVar2._0_8_ = local_1a0._0_8_;
  auVar1._8_8_ = local_1c0._8_8_;
  auVar1._0_8_ = local_1c0._0_8_;
  auVar10._8_8_ = local_1e0._8_8_;
  auVar10._0_8_ = local_1e0._0_8_;
  if ((!bVar7) &&
     (local_1e0 = auVar10, local_1c0 = auVar1, local_1a0 = auVar2, local_180 = auVar3,
     local_e0 = auVar4, local_c0 = auVar5, local_a0 = auVar6, *team != None)) {
    local_90 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(RenX::tags + 0x3a8));
    local_a0 = RenX::getTeamColor(*team);
    RenX::replace_tag(local_70,local_90._M_len,local_90._M_str,local_a0._0_8_,local_a0._8_8_);
    local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(RenX::tags + 0x3c8));
    local_c0 = RenX::getTeamName(*team);
    RenX::replace_tag(local_70,local_b0._M_len,local_b0._M_str,local_c0._0_8_,local_c0._8_8_);
    local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(RenX::tags + 1000));
    local_e0 = RenX::getFullTeamName(*team);
    RenX::replace_tag(local_70,local_d0._M_len,local_d0._M_str,local_e0._0_8_,local_e0._8_8_);
    local_f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)(RenX::tags + 0x1548));
    string_printf_abi_cxx11_(&local_120,"%d",(ulong)local_38);
    local_100 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_120);
    RenX::replace_tag(local_70,local_f0._M_len,local_f0._M_str,local_100._M_len,local_100._M_str);
    std::__cxx11::string::~string((string *)&local_120);
    local_130 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)(RenX::tags + 0x1568));
    string_printf_abi_cxx11_(&local_160,"%d",(ulong)local_3c);
    local_140 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_160);
    RenX::replace_tag(local_70,local_130._M_len,local_130._M_str,local_140._M_len,local_140._M_str);
    std::__cxx11::string::~string((string *)&local_160);
    local_170 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)(RenX::tags + 0xa08));
    local_180 = RenX::getTeamColor(TVar8);
    RenX::replace_tag(local_70,local_170._M_len,local_170._M_str,local_180._0_8_,local_180._8_8_);
    local_190 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)(RenX::tags + 0xa28));
    local_1a0 = RenX::getTeamName(TVar8);
    RenX::replace_tag(local_70,local_190._M_len,local_190._M_str,local_1a0._0_8_,local_1a0._8_8_);
    local_1b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)(RenX::tags + 0xa48));
    local_1c0 = RenX::getFullTeamName(TVar8);
    RenX::replace_tag(local_70,local_1b0._M_len,local_1b0._M_str,local_1c0._0_8_,local_1c0._8_8_);
    local_1d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)(RenX::tags + 0x1508));
    local_1e0 = RenX::translateWinType(winType);
    RenX::replace_tag(local_70,local_1d0._M_len,local_1d0._M_str,local_1e0._0_8_,local_1e0._8_8_);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_568 = (code *)msg.field_2._8_8_;
    }
    else {
      local_568 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    local_1f0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
    (*local_568)(server,local_1f0._M_len,local_1f0._M_str);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
             &this->gameOverScoreFmt);
  if (*team == None) {
    bVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
    if (!bVar7) {
      local_200 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0x3a8));
      local_210 = RenX::getTeamColor(GDI);
      RenX::replace_tag(local_70,local_200._M_len,local_200._M_str,local_210._0_8_,local_210._8_8_);
      local_220 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0x3c8));
      local_230 = RenX::getTeamName(GDI);
      RenX::replace_tag(local_70,local_220._M_len,local_220._M_str,local_230._0_8_,local_230._8_8_);
      local_240 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 1000));
      local_250 = RenX::getFullTeamName(GDI);
      RenX::replace_tag(local_70,local_240._M_len,local_240._M_str,local_250._0_8_,local_250._8_8_);
      local_260 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0x1548));
      string_printf_abi_cxx11_(&local_290,"%d",(ulong)local_38);
      local_270 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_290);
      RenX::replace_tag(local_70,local_260._M_len,local_260._M_str,local_270._M_len,local_270._M_str
                       );
      std::__cxx11::string::~string((string *)&local_290);
      local_2a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0x1568));
      string_printf_abi_cxx11_(&local_2d0,"%d",(ulong)local_3c);
      local_2b0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2d0);
      RenX::replace_tag(local_70,local_2a0._M_len,local_2a0._M_str,local_2b0._M_len,local_2b0._M_str
                       );
      std::__cxx11::string::~string((string *)&local_2d0);
      local_2e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0xa08));
      local_2f0 = RenX::getTeamColor(Nod);
      RenX::replace_tag(local_70,local_2e0._M_len,local_2e0._M_str,local_2f0._0_8_,local_2f0._8_8_);
      local_300 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0xa28));
      local_310 = RenX::getTeamName(Nod);
      RenX::replace_tag(local_70,local_300._M_len,local_300._M_str,local_310._0_8_,local_310._8_8_);
      local_320 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0xa48));
      local_330 = RenX::getFullTeamName(Nod);
      RenX::replace_tag(local_70,local_320._M_len,local_320._M_str,local_330._0_8_,local_330._8_8_);
      local_340 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0x1508));
      local_350 = RenX::translateWinType(winType);
      RenX::replace_tag(local_70,local_340._M_len,local_340._M_str,local_350._0_8_,local_350._8_8_);
      if ((msg.field_2._8_8_ & 1) == 0) {
        local_5f8 = (code *)msg.field_2._8_8_;
      }
      else {
        local_5f8 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
      }
      local_360 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
      (*local_5f8)(server,local_360._M_len,local_360._M_str);
    }
  }
  else {
    bVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                      );
    if (!bVar7) {
      local_370 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0x3a8));
      local_380 = RenX::getTeamColor(*team);
      RenX::replace_tag(local_70,local_370._M_len,local_370._M_str,local_380._0_8_,local_380._8_8_);
      local_390 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0x3c8));
      local_3a0 = RenX::getTeamName(*team);
      RenX::replace_tag(local_70,local_390._M_len,local_390._M_str,local_3a0._0_8_,local_3a0._8_8_);
      local_3b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 1000));
      local_3c0 = RenX::getFullTeamName(*team);
      RenX::replace_tag(local_70,local_3b0._M_len,local_3b0._M_str,local_3c0._0_8_,local_3c0._8_8_);
      local_3d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0x1548));
      string_printf_abi_cxx11_(&local_400,"%d",(ulong)local_38);
      local_3e0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_400);
      RenX::replace_tag(local_70,local_3d0._M_len,local_3d0._M_str,local_3e0._M_len,local_3e0._M_str
                       );
      std::__cxx11::string::~string((string *)&local_400);
      local_410 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)(RenX::tags + 0x1568));
      string_printf_abi_cxx11_(&local_440,"%d",(ulong)local_3c);
      local_420 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_440);
      RenX::replace_tag(local_70,local_410._M_len,local_410._M_str,local_420._M_len,local_420._M_str
                       );
      std::__cxx11::string::~string((string *)&local_440);
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(RenX::tags + 0xa08));
      auVar10 = RenX::getTeamColor(TVar8);
      local_450 = _Var9._M_len;
      local_448 = _Var9._M_str;
      RenX::replace_tag(local_70,local_450,local_448,auVar10._0_8_,auVar10._8_8_);
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(RenX::tags + 0xa28));
      auVar10 = RenX::getTeamName(TVar8);
      local_470 = _Var9._M_len;
      local_468 = _Var9._M_str;
      RenX::replace_tag(local_70,local_470,local_468,auVar10._0_8_,auVar10._8_8_);
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(RenX::tags + 0xa48));
      auVar10 = RenX::getFullTeamName(TVar8);
      local_490 = _Var9._M_len;
      local_488 = _Var9._M_str;
      RenX::replace_tag(local_70,local_490,local_488,auVar10._0_8_,auVar10._8_8_);
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(RenX::tags + 0x1508));
      auVar10 = RenX::translateWinType(winType);
      local_4b0 = _Var9._M_len;
      local_4a8 = _Var9._M_str;
      RenX::replace_tag(local_70,local_4b0,local_4a8,auVar10._0_8_,auVar10._8_8_);
      if ((msg.field_2._8_8_ & 1) == 0) {
        local_688 = (code *)msg.field_2._8_8_;
      }
      else {
        local_688 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
      }
      _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
      local_4d0 = _Var9._M_len;
      local_4c8 = _Var9._M_str;
      (*local_688)(server,local_4d0,local_4c8);
    }
  }
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnGameOver(RenX::Server &server, RenX::WinType winType, const RenX::TeamType &team, int gScore, int nScore)
{
	RenX::TeamType loserTeam = RenX::getEnemy(team);
	int winScore;
	int loseScore;
	switch (team)
	{
	default:
	case RenX::TeamType::GDI:
		winScore = gScore;
		loseScore = nScore;
		break;
	case RenX::TeamType::Nod:
		winScore = nScore;
		loseScore = gScore;
		break;
	}

	logFuncType func;
	if (RenX_LoggingPlugin::gameOverPublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg;
	if (winType == RenX::WinType::Tie)
	{
		if (team == RenX::TeamType::None)
			msg = this->gameOverTieNoWinFmt;
		else
			msg = this->gameOverTieFmt;
	}
	else
		msg = this->gameOverFmt;

	if (!msg.empty() && team != RenX::TeamType::None)
	{
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WIN_SCORE_TAG, string_printf("%d", winScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_LOSE_SCORE_TAG, string_printf("%d", loseScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, RenX::translateWinType(winType));
		(server.*func)(msg);
	}

	msg = this->gameOverScoreFmt;
	if (team == RenX::TeamType::None)
	{
		if (!msg.empty())
		{
			RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(RenX::TeamType::GDI));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(RenX::TeamType::GDI));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(RenX::TeamType::GDI));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_WIN_SCORE_TAG, string_printf("%d", winScore));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_LOSE_SCORE_TAG, string_printf("%d", loseScore));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(RenX::TeamType::Nod));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(RenX::TeamType::Nod));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(RenX::TeamType::Nod));
			RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, RenX::translateWinType(winType));
			(server.*func)(msg);
		}
	}
	else if (!msg.empty())
	{
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_COLOR_TAG, RenX::getTeamColor(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_SHORT_TAG, RenX::getTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_TEAM_LONG_TAG, RenX::getFullTeamName(team));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WIN_SCORE_TAG, string_printf("%d", winScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_LOSE_SCORE_TAG, string_printf("%d", loseScore));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_COLOR_TAG, RenX::getTeamColor(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_SHORT_TAG, RenX::getTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_VICTIM_TEAM_LONG_TAG, RenX::getFullTeamName(loserTeam));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, RenX::translateWinType(winType));
		(server.*func)(msg);
	}
}